

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg.cpp
# Opt level: O0

Configuration * __thiscall TagConfiguration::configuration(TagConfiguration *this)

{
  bool bVar1;
  TagVecOfTags *this_00;
  int *piVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RSI;
  Configuration *in_RDI;
  shared_ptr<TagVecOfTags> *p;
  const_iterator __end1;
  const_iterator __begin1;
  vector_of_tags_t *__range1;
  Configuration *cfg;
  value_type *in_stack_ffffffffffffff48;
  Configuration *in_stack_ffffffffffffff50;
  __normal_iterator<const_std::shared_ptr<TagVecOfTags>_*,_std::vector<std::shared_ptr<TagVecOfTags>,_std::allocator<std::shared_ptr<TagVecOfTags>_>_>_>
  local_38;
  vector_of_tags_t *local_30;
  undefined7 in_stack_ffffffffffffffe8;
  undefined1 uVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  
  uVar3 = 0;
  this_01 = in_RSI;
  Configuration::Configuration(in_stack_ffffffffffffff50);
  this_00 = (TagVecOfTags *)
            cfgfile::
            tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
            ::value((tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
                     *)(in_RSI + 4));
  std::__cxx11::string::operator=((string *)in_RDI,(string *)this_00);
  cfgfile::
  tag_scalar_vector_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
  ::values((tag_scalar_vector_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
            *)(in_RSI + 0xc));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(this_01,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)CONCAT17(uVar3,in_stack_ffffffffffffffe8));
  piVar2 = cfgfile::tag_scalar_t<int,_cfgfile::string_trait_t>::value
                     ((tag_scalar_t<int,_cfgfile::string_trait_t> *)(in_RSI + 0x12));
  in_RDI->m_intValue = *piVar2;
  local_30 = cfgfile::tag_vector_of_tags_t<TagVecOfTags,_cfgfile::string_trait_t>::values
                       ((tag_vector_of_tags_t<TagVecOfTags,_cfgfile::string_trait_t> *)
                        &in_RSI[0x16].
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_38._M_current =
       (shared_ptr<TagVecOfTags> *)
       std::vector<std::shared_ptr<TagVecOfTags>,_std::allocator<std::shared_ptr<TagVecOfTags>_>_>::
       begin((vector<std::shared_ptr<TagVecOfTags>,_std::allocator<std::shared_ptr<TagVecOfTags>_>_>
              *)in_stack_ffffffffffffff48);
  std::vector<std::shared_ptr<TagVecOfTags>,_std::allocator<std::shared_ptr<TagVecOfTags>_>_>::end
            ((vector<std::shared_ptr<TagVecOfTags>,_std::allocator<std::shared_ptr<TagVecOfTags>_>_>
              *)in_stack_ffffffffffffff48);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_std::shared_ptr<TagVecOfTags>_*,_std::vector<std::shared_ptr<TagVecOfTags>,_std::allocator<std::shared_ptr<TagVecOfTags>_>_>_>
                             *)in_stack_ffffffffffffff50,
                            (__normal_iterator<const_std::shared_ptr<TagVecOfTags>_*,_std::vector<std::shared_ptr<TagVecOfTags>,_std::allocator<std::shared_ptr<TagVecOfTags>_>_>_>
                             *)in_stack_ffffffffffffff48), bVar1) {
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<TagVecOfTags>_*,_std::vector<std::shared_ptr<TagVecOfTags>,_std::allocator<std::shared_ptr<TagVecOfTags>_>_>_>
    ::operator*(&local_38);
    in_stack_ffffffffffffff50 = (Configuration *)&in_RDI->m_vectorOfTags;
    std::__shared_ptr_access<TagVecOfTags,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<TagVecOfTags,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x14e18c);
    TagVecOfTags::pair(this_00);
    std::vector<Configuration::Pair,_std::allocator<Configuration::Pair>_>::push_back
              ((vector<Configuration::Pair,_std::allocator<Configuration::Pair>_> *)
               in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    Configuration::Pair::~Pair((Pair *)0x14e1b6);
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<TagVecOfTags>_*,_std::vector<std::shared_ptr<TagVecOfTags>,_std::allocator<std::shared_ptr<TagVecOfTags>_>_>_>
    ::operator++(&local_38);
  }
  return in_RDI;
}

Assistant:

Configuration
TagConfiguration::configuration() const
{
	Configuration cfg;

	cfg.m_stringValue = m_stringValue.value();
	cfg.m_listOfStringValues = m_listOfStringValues.values();
	cfg.m_intValue = m_intValue.value();

	for( auto & p : m_vecOfTags.values() )
		cfg.m_vectorOfTags.push_back( p->pair() );

	return cfg;
}